

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRelDecomposes::~IfcRelDecomposes(IfcRelDecomposes *this)

{
  void *pvVar1;
  
  *(undefined8 *)this = 0x8441a0;
  *(undefined8 *)&this->field_0xc8 = 0x844218;
  *(undefined8 *)&this->field_0x88 = 0x8441c8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x8441f0;
  pvVar1 = *(void **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>).
                      field_0x18;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0xc0 - (long)pvVar1);
  }
  *(undefined8 *)this = 0x844330;
  *(undefined8 *)&this->field_0xc8 = 0x844358;
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60,*(long *)&this->field_0x70 + 1);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38,*(long *)&this->field_0x48 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,0xe0);
  return;
}

Assistant:

IfcRelDecomposes() : Object("IfcRelDecomposes") {}